

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_settings.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBSettingsInit(ClientContext *context,TableFunctionInitInput *input)

{
  set_global_function_t p_Var1;
  SettingLookupResult value_00;
  DBConfig *pDVar2;
  idx_t iVar3;
  ConfigurationOption *pCVar4;
  pointer pDVar5;
  idx_t target_index;
  __node_base *local_198;
  _Head_base<0UL,_duckdb::DuckDBSettingsData_*,_false> local_190;
  ClientContext *local_188;
  DuckDBSettingValue value;
  string setting_str_val;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  LogicalType local_88;
  Value setting_val;
  
  make_uniq<duckdb::DuckDBSettingsData>();
  local_188 = (ClientContext *)input;
  pDVar2 = DBConfig::GetConfig((ClientContext *)input);
  iVar3 = DBConfig::GetOptionCount();
  for (target_index = 0; iVar3 != target_index; target_index = target_index + 1) {
    option = DBConfig::GetOptionByIndex(target_index);
    value.name._M_dataplus._M_p = (pointer)&value.name.field_2;
    value.name._M_string_length = 0;
    value.name.field_2._M_local_buf[0] = '\0';
    value.value._M_dataplus._M_p = (pointer)&value.value.field_2;
    value.value._M_string_length = 0;
    value.value.field_2._M_local_buf[0] = '\0';
    value.description._M_dataplus._M_p = (pointer)&value.description.field_2;
    value.description._M_string_length = 0;
    value.description.field_2._M_local_buf[0] = '\0';
    value.input_type._M_dataplus._M_p = (pointer)&value.input_type.field_2;
    value.input_type._M_string_length = 0;
    value.input_type.field_2._M_local_buf[0] = '\0';
    value.scope._M_dataplus._M_p = (pointer)&value.scope.field_2;
    value.scope._M_string_length = 0;
    value.scope.field_2._M_local_buf[0] = '\0';
    pCVar4 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    p_Var1 = pCVar4->set_global;
    optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    ::std::__cxx11::string::assign((char *)&value);
    pCVar4 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    (*pCVar4->get_setting)(&setting_val,local_188);
    Value::ToString_abi_cxx11_(&setting_str_val,&setting_val);
    ::std::__cxx11::string::operator=((string *)&value.value,(string *)&setting_str_val);
    ::std::__cxx11::string::~string((string *)&setting_str_val);
    Value::~Value(&setting_val);
    optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    ::std::__cxx11::string::assign((char *)&value.description);
    optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    ::std::__cxx11::string::assign((char *)&value.input_type);
    EnumUtil::ToString<duckdb::SettingScope>
              ((string *)&setting_val,p_Var1 == (set_global_function_t)0x0);
    ::std::__cxx11::string::operator=((string *)&value.scope,(string *)&setting_val);
    ::std::__cxx11::string::~string((string *)&setting_val);
    pDVar5 = unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
             ::operator->((unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
                           *)&local_190);
    ::std::vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>::
    emplace_back<duckdb::DuckDBSettingValue>
              (&(pDVar5->settings).
                super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>
               ,&value);
    DuckDBSettingValue::~DuckDBSettingValue(&value);
  }
  local_198 = &(pDVar2->extension_parameters)._M_h._M_before_begin;
  while( true ) {
    local_198 = local_198->_M_nxt;
    if (local_198 == (__node_base *)0x0) break;
    LogicalType::LogicalType(&local_88,SQLNULL);
    Value::Value(&setting_val,&local_88);
    LogicalType::~LogicalType(&local_88);
    setting_str_val._M_dataplus._M_p = (pointer)&setting_str_val.field_2;
    setting_str_val._M_string_length = 0;
    setting_str_val.field_2._M_local_buf[0] = '\0';
    value_00 = ClientContext::TryGetCurrentSetting(local_188,(string *)(local_198 + 1),&setting_val)
    ;
    if (value_00.scope == INVALID) {
      value_00.scope = GLOBAL;
    }
    else {
      Value::ToString_abi_cxx11_(&value.name,&setting_val);
      ::std::__cxx11::string::operator=((string *)&setting_str_val,(string *)&value);
      ::std::__cxx11::string::~string((string *)&value);
    }
    value.name._M_dataplus._M_p = (pointer)&value.name.field_2;
    value.name._M_string_length = 0;
    value.name.field_2._M_local_buf[0] = '\0';
    value.value._M_dataplus._M_p = (pointer)&value.value.field_2;
    value.value._M_string_length = 0;
    value.value.field_2._M_local_buf[0] = '\0';
    value.description._M_dataplus._M_p = (pointer)&value.description.field_2;
    value.description._M_string_length = 0;
    value.description.field_2._M_local_buf[0] = '\0';
    value.input_type._M_dataplus._M_p = (pointer)&value.input_type.field_2;
    value.input_type._M_string_length = 0;
    value.input_type.field_2._M_local_buf[0] = '\0';
    value.scope._M_dataplus._M_p = (pointer)&value.scope.field_2;
    value.scope._M_string_length = 0;
    value.scope.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::_M_assign((string *)&value);
    ::std::__cxx11::string::operator=((string *)&value.value,(string *)&setting_str_val);
    ::std::__cxx11::string::_M_assign((string *)&value.description);
    LogicalType::ToString_abi_cxx11_((string *)&option,(LogicalType *)(local_198 + 9));
    ::std::__cxx11::string::operator=((string *)&value.input_type,(string *)&option);
    ::std::__cxx11::string::~string((string *)&option);
    EnumUtil::ToString<duckdb::SettingScope>((string *)&option,value_00.scope);
    ::std::__cxx11::string::operator=((string *)&value.scope,(string *)&option);
    ::std::__cxx11::string::~string((string *)&option);
    pDVar5 = unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
             ::operator->((unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
                           *)&local_190);
    ::std::vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>::
    emplace_back<duckdb::DuckDBSettingValue>
              (&(pDVar5->settings).
                super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>
               ,&value);
    DuckDBSettingValue::~DuckDBSettingValue(&value);
    ::std::__cxx11::string::~string((string *)&setting_str_val);
    Value::~Value(&setting_val);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_190._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBSettingsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBSettingsData>();

	auto &config = DBConfig::GetConfig(context);
	auto options_count = DBConfig::GetOptionCount();
	for (idx_t i = 0; i < options_count; i++) {
		auto option = DBConfig::GetOptionByIndex(i);
		D_ASSERT(option);
		DuckDBSettingValue value;
		auto scope = option->set_global ? SettingScope::GLOBAL : SettingScope::LOCAL;
		value.name = option->name;
		value.value = option->get_setting(context).ToString();
		value.description = option->description;
		value.input_type = option->parameter_type;
		value.scope = EnumUtil::ToString(scope);

		result->settings.push_back(std::move(value));
	}
	for (auto &ext_param : config.extension_parameters) {
		Value setting_val;
		string setting_str_val;
		auto scope = SettingScope::GLOBAL;
		auto lookup_result = context.TryGetCurrentSetting(ext_param.first, setting_val);
		if (lookup_result) {
			setting_str_val = setting_val.ToString();
			scope = lookup_result.GetScope();
		}
		DuckDBSettingValue value;
		value.name = ext_param.first;
		value.value = std::move(setting_str_val);
		value.description = ext_param.second.description;
		value.input_type = ext_param.second.type.ToString();
		value.scope = EnumUtil::ToString(scope);

		result->settings.push_back(std::move(value));
	}
	return std::move(result);
}